

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

ssize_t __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::send
          (RpcServerResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  RpcConnectionState *this_00;
  Builder payload;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable_00;
  OutgoingRpcMessage *pOVar1;
  size_t sVar2;
  Array<unsigned_int> *t;
  undefined4 in_register_00000034;
  long lVar3;
  Array<int> local_d8;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *local_78;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMStack_70;
  undefined1 local_60 [8];
  Array<unsigned_int> exports;
  Vector<int> fds;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  RpcServerResponseImpl *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  join_0x00000010_0x00000000_ =
       BuilderCapabilityTable::getTable((BuilderCapabilityTable *)(lVar3 + 0x20));
  kj::Vector<int>::Vector((Vector<int> *)&exports.disposer);
  this_00 = *(RpcConnectionState **)(lVar3 + 8);
  local_78 = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)fds.builder.disposer;
  pMStack_70 = capTable.ptr;
  local_88 = *(undefined8 *)(lVar3 + 0x68);
  local_a8 = *(undefined8 *)(lVar3 + 0x48);
  uStack_a0 = *(undefined8 *)(lVar3 + 0x50);
  local_98 = *(undefined8 *)(lVar3 + 0x58);
  uStack_90 = *(undefined8 *)(lVar3 + 0x60);
  kj::Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&>::Maybe
            (&local_b0,
             (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)
             (lVar3 + 0x70));
  capTable_00.size_ = (size_t)pMStack_70;
  capTable_00.ptr = local_78;
  payload._builder.capTable = (CapTableBuilder *)uStack_a0;
  payload._builder.segment = (SegmentBuilder *)local_a8;
  payload._builder.data = (void *)local_98;
  payload._builder.pointers = (WirePointer *)uStack_90;
  payload._builder.dataSize = (undefined4)local_88;
  payload._builder.pointerCount = local_88._4_2_;
  payload._builder._38_2_ = local_88._6_2_;
  writeDescriptors((Array<unsigned_int> *)local_60,this_00,capTable_00,payload,
                   (Vector<int> *)&exports.disposer,&local_b0);
  pOVar1 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)(lVar3 + 0x10));
  kj::Vector<int>::releaseAsArray(&local_d8,(Vector<int> *)&exports.disposer);
  (*pOVar1->_vptr_OutgoingRpcMessage[1])(pOVar1,&local_d8);
  kj::Array<int>::~Array(&local_d8);
  pOVar1 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)(lVar3 + 0x10));
  (*pOVar1->_vptr_OutgoingRpcMessage[2])();
  sVar2 = kj::ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::size
                    ((ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)
                     &fds.builder.disposer);
  if (sVar2 == 0) {
    kj::Maybe<kj::Array<unsigned_int>_>::Maybe((Maybe<kj::Array<unsigned_int>_> *)this);
  }
  else {
    t = kj::mv<kj::Array<unsigned_int>>((Array<unsigned_int> *)local_60);
    kj::Maybe<kj::Array<unsigned_int>_>::Maybe((Maybe<kj::Array<unsigned_int>_> *)this,t);
  }
  kj::Array<unsigned_int>::~Array((Array<unsigned_int> *)local_60);
  kj::Vector<int>::~Vector((Vector<int> *)&exports.disposer);
  return (ssize_t)this;
}

Assistant:

kj::Maybe<kj::Array<ExportId>> send() {
      // Send the response and return the export list.  Returns kj::none if there were no caps.
      // (Could return a non-null empty array if there were caps but none of them were exports.)

      // Build the cap table.
      auto capTable = this->capTable.getTable();
      kj::Vector<int> fds;
      auto exports = connectionState.writeDescriptors(
          capTable, payload, fds, resolutionsAtReturnTime);
      message->setFds(fds.releaseAsArray());

      message->send();
      if (capTable.size() == 0) {
        return kj::none;
      } else {
        return kj::mv(exports);
      }
    }